

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_octahedron_transform.cc
# Opt level: O2

bool __thiscall
draco::AttributeOctahedronTransform::InverseTransformAttribute
          (AttributeOctahedronTransform *this,PointAttribute *attribute,
          PointAttribute *target_attribute)

{
  ValueType VVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long lVar5;
  undefined8 *puVar6;
  long lVar7;
  float att_val [3];
  OctahedronToolBox octahedron_tool_box;
  undefined8 local_50;
  undefined4 local_48;
  OctahedronToolBox local_44;
  
  if (((target_attribute->super_GeometryAttribute).data_type_ == DT_FLOAT32) &&
     ((target_attribute->super_GeometryAttribute).num_components_ == '\x03')) {
    VVar1 = target_attribute->num_unique_entries_;
    lVar5 = (attribute->super_GeometryAttribute).byte_offset_;
    lVar7 = (long)(((attribute->super_GeometryAttribute).buffer_)->data_).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    lVar2 = (target_attribute->super_GeometryAttribute).byte_offset_;
    lVar3 = (long)(((target_attribute->super_GeometryAttribute).buffer_)->data_).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_44.quantization_bits_ = -1;
    local_44.max_quantized_value_ = -1;
    local_44.max_value_ = -1;
    local_44.dequantization_scale_ = 1.0;
    local_44.center_value_ = -1;
    bVar4 = OctahedronToolBox::SetQuantizationBits(&local_44,this->quantization_bits_);
    if (bVar4) {
      puVar6 = (undefined8 *)(lVar3 + lVar2);
      lVar7 = lVar7 + lVar5;
      for (lVar5 = 0; VVar1 != (ValueType)lVar5; lVar5 = lVar5 + 1) {
        OctahedronToolBox::QuantizedOctahedralCoordsToUnitVector
                  (&local_44,*(int32_t *)(lVar7 + lVar5 * 8),*(int32_t *)(lVar7 + 4 + lVar5 * 8),
                   (float *)&local_50);
        *(undefined4 *)(puVar6 + 1) = local_48;
        *puVar6 = local_50;
        puVar6 = (undefined8 *)((long)puVar6 + 0xc);
      }
    }
    return bVar4;
  }
  return false;
}

Assistant:

bool AttributeOctahedronTransform::InverseTransformAttribute(
    const PointAttribute &attribute, PointAttribute *target_attribute) {
  if (target_attribute->data_type() != DT_FLOAT32) {
    return false;
  }

  const int num_points = target_attribute->size();
  const int num_components = target_attribute->num_components();
  if (num_components != 3) {
    return false;
  }
  constexpr int kEntrySize = sizeof(float) * 3;
  float att_val[3];
  const int32_t *source_attribute_data = reinterpret_cast<const int32_t *>(
      attribute.GetAddress(AttributeValueIndex(0)));
  uint8_t *target_address =
      target_attribute->GetAddress(AttributeValueIndex(0));
  OctahedronToolBox octahedron_tool_box;
  if (!octahedron_tool_box.SetQuantizationBits(quantization_bits_)) {
    return false;
  }
  for (uint32_t i = 0; i < num_points; ++i) {
    const int32_t s = *source_attribute_data++;
    const int32_t t = *source_attribute_data++;
    octahedron_tool_box.QuantizedOctahedralCoordsToUnitVector(s, t, att_val);

    // Store the decoded floating point values into the attribute buffer.
    std::memcpy(target_address, att_val, kEntrySize);
    target_address += kEntrySize;
  }
  return true;
}